

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

void __thiscall dns::Message::encode(Message *this,char *buffer,uint bufferSize,uint *validSize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  pointer ppQVar6;
  pointer ppRVar7;
  undefined1 auVar8 [16];
  Buffer buff;
  undefined1 local_50 [40];
  pointer local_28;
  undefined8 uVar4;
  
  *validSize = 0;
  local_50._24_16_ = (undefined1  [16])0x0;
  local_28 = (pointer)0x0;
  local_50._0_8_ = buffer;
  local_50._8_4_ = bufferSize;
  local_50._16_8_ = buffer;
  Buffer::put16bits((Buffer *)local_50,this->mId);
  uVar1 = this->mQr;
  uVar2 = this->mOpCode;
  uVar3 = this->mAA;
  uVar5 = this->mTC;
  uVar4 = CONCAT44(uVar5,uVar3);
  auVar8._8_4_ = 0x200;
  auVar8._0_8_ = 0x80000000800;
  auVar8._12_4_ = 0x200;
  Buffer::put16bits((Buffer *)local_50,
                    (uint)((auVar8._8_8_ & 0xffffffff) * (ulong)(uint)uVar5) & 0x200 |
                    uVar2 * 0x800 & 0x7800U |
                    (uint)((uVar4 & 0xffffffff) * 0x400) & 0x400 | uVar1 * 0x8000 & 0x8000U |
                    this->mRCode & 0xf | (this->mRA & 1) << 7 | (this->mRD & 1) << 8);
  Buffer::put16bits((Buffer *)local_50,
                    (uint)((ulong)((long)(this->mQueries).
                                         super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mQueries).
                                        super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  Buffer::put16bits((Buffer *)local_50,
                    (uint)((ulong)((long)(this->mAnswers).
                                         super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mAnswers).
                                        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  Buffer::put16bits((Buffer *)local_50,
                    (uint)((ulong)((long)(this->mAuthorities).
                                         super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mAuthorities).
                                        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  Buffer::put16bits((Buffer *)local_50,
                    (uint)((ulong)((long)(this->mAdditional).
                                         super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->mAdditional).
                                        super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  ppQVar6 = (this->mQueries).
            super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppQVar6 !=
      (this->mQueries).super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      QuerySection::encode(*ppQVar6,(Buffer *)local_50);
      ppQVar6 = ppQVar6 + 1;
    } while (ppQVar6 !=
             (this->mQueries).
             super__Vector_base<dns::QuerySection_*,_std::allocator<dns::QuerySection_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppRVar7 = (this->mAnswers).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar7 !=
      (this->mAnswers).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ResourceRecord::encode(*ppRVar7,(Buffer *)local_50);
      ppRVar7 = ppRVar7 + 1;
    } while (ppRVar7 !=
             (this->mAnswers).
             super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppRVar7 = (this->mAuthorities).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar7 !=
      (this->mAuthorities).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ResourceRecord::encode(*ppRVar7,(Buffer *)local_50);
      ppRVar7 = ppRVar7 + 1;
    } while (ppRVar7 !=
             (this->mAuthorities).
             super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  ppRVar7 = (this->mAdditional).
            super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar7 !=
      (this->mAdditional).
      super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      ResourceRecord::encode(*ppRVar7,(Buffer *)local_50);
      ppRVar7 = ppRVar7 + 1;
    } while (ppRVar7 !=
             (this->mAdditional).
             super__Vector_base<dns::ResourceRecord_*,_std::allocator<dns::ResourceRecord_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  *validSize = local_50._16_4_ - local_50._0_4_;
  if ((pointer)local_50._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_50._24_8_,(long)local_28 - local_50._24_8_);
  }
  return;
}

Assistant:

void Message::encode(char* buffer, const uint bufferSize, uint &validSize)
{
    validSize = 0;
    Buffer buff(buffer, bufferSize);

    // encode header 

    buff.put16bits(mId);
    uint fields = ((mQr & 1) << 15);
    fields += ((mOpCode & 15) << 11);
    fields += ((mAA & 1) << 10);
    fields += ((mTC & 1) << 9);
    fields += ((mRD & 1) << 8);
    fields += ((mRA & 1) << 7);
    fields += ((mRCode & 15));
    buff.put16bits(fields);
    buff.put16bits(mQueries.size());
    buff.put16bits(mAnswers.size());
    buff.put16bits(mAuthorities.size());
    buff.put16bits(mAdditional.size());

    // encode queries
    for(std::vector<QuerySection*>::iterator it = mQueries.begin(); it != mQueries.end(); ++it)
        (*it)->encode(buff);

    // encode answers 
    for(std::vector<ResourceRecord*>::iterator it = mAnswers.begin(); it != mAnswers.end(); ++it)
        (*it)->encode(buff);

    // encode authorities
    for(std::vector<ResourceRecord*>::iterator it = mAuthorities.begin(); it != mAuthorities.end(); ++it)
        (*it)->encode(buff);

    // encode additional 
    for(std::vector<ResourceRecord*>::iterator it = mAdditional.begin(); it != mAdditional.end(); ++it)
        (*it)->encode(buff);

    validSize = buff.getPos();
}